

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

MemTxResult
memory_region_dispatch_write_x86_64
          (uc_struct_conflict *uc,MemoryRegion *mr,hwaddr addr,uint64_t data,MemOp op,
          MemTxAttrs attrs)

{
  MemoryRegionOps *pMVar1;
  _Bool _Var2;
  MemTxResult MVar3;
  uint size;
  code *access_fn;
  uint64_t data_local;
  
  size = 1 << ((byte)op & 3);
  data_local = data;
  _Var2 = memory_region_access_valid_x86_64(uc,mr,addr,size,true,attrs);
  MVar3 = 2;
  if (_Var2) {
    adjust_endianness(mr,&data_local,op);
    pMVar1 = mr->ops;
    access_fn = memory_region_write_accessor;
    if (pMVar1->write == (_func_void_uc_struct_ptr_void_ptr_hwaddr_uint64_t_uint_conflict15 *)0x0) {
      access_fn = memory_region_write_with_attrs_accessor;
    }
    MVar3 = access_with_adjusted_size
                      (uc,addr,&data_local,size,(pMVar1->impl).min_access_size,
                       (pMVar1->impl).max_access_size,access_fn,mr,attrs);
  }
  return MVar3;
}

Assistant:

MemTxResult memory_region_dispatch_write(struct uc_struct *uc, MemoryRegion *mr,
                                         hwaddr addr,
                                         uint64_t data,
                                         MemOp op,
                                         MemTxAttrs attrs)
{
    unsigned size = memop_size(op);

    if (!memory_region_access_valid(uc, mr, addr, size, true, attrs)) {
        unassigned_mem_write(mr, addr, data, size);
        return MEMTX_DECODE_ERROR;
    }

    adjust_endianness(mr, &data, op);

    if (mr->ops->write) {
        return access_with_adjusted_size(uc, addr, &data, size,
                                         mr->ops->impl.min_access_size,
                                         mr->ops->impl.max_access_size,
                                         memory_region_write_accessor, mr,
                                         attrs);
    } else {
        return
            access_with_adjusted_size(uc, addr, &data, size,
                                      mr->ops->impl.min_access_size,
                                      mr->ops->impl.max_access_size,
                                      memory_region_write_with_attrs_accessor,
                                      mr, attrs);
    }
}